

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# utf8.h
# Opt level: O2

void * utf8pbrk(void *str,void *accept)

{
  bool bVar1;
  char cVar2;
  char *pcVar3;
  char *s;
  
  cVar2 = *str;
LAB_0010efa4:
  pcVar3 = (char *)accept;
  if (cVar2 == '\0') {
    return (void *)0x0;
  }
  do {
    bVar1 = false;
    while( true ) {
      if (*pcVar3 == '\0') {
        if (bVar1) {
          return (char *)str;
        }
        cVar2 = *(char *)((long)str + 1);
        str = (void *)((long)str + 1);
        goto LAB_0010efa4;
      }
      if (bVar1) {
        return (char *)str;
      }
      if (*pcVar3 != *str) break;
      bVar1 = true;
      pcVar3 = pcVar3 + 1;
    }
    pcVar3 = pcVar3 + 1;
  } while( true );
}

Assistant:

void *utf8pbrk(const void *str, const void *accept) {
  const char *s = (const char *)str;

  while ('\0' != *s) {
    const char *a = (const char *)accept;
    size_t offset = 0;

    while ('\0' != *a) {
      // checking that if *a is the start of a utf8 codepoint
      // (it is not 0b10xxxxxx) and we have successfully matched
      // a previous character (0 < offset) - we found a match
      if ((0x80 != (0xc0 & *a)) && (0 < offset)) {
        return (void *)s;
      } else {
        if (*a == s[offset]) {
          // part of a utf8 codepoint matched, so move our checking
          // onwards to the next byte
          offset++;
          a++;
        } else {
          // r could be in the middle of an unmatching utf8 code point,
          // so we need to march it on to the next character beginning,

          do {
            a++;
          } while (0x80 == (0xc0 & *a));

          // reset offset too as we found a mismatch
          offset = 0;
        }
      }
    }

    // we found a match on the last utf8 codepoint
    if (0 < offset) {
      return (void *)s;
    }

    // the current utf8 codepoint in src did not match accept, but src
    // could have been partway through a utf8 codepoint, so we need to
    // march it onto the next utf8 codepoint starting byte
    do {
      s++;
    } while ((0x80 == (0xc0 & *s)));
  }

  return 0;
}